

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O3

ValueType * __thiscall
Memory::AllocateArray<Memory::Recycler,ValueType,false>
          (Memory *this,Recycler *allocator,offset_in_Recycler_to_subr AllocFunc,size_t count)

{
  ValueType *pVVar1;
  size_t sVar2;
  
  if (count == 0) {
    Recycler::ClearTrackAllocInfo((Recycler *)this,(TrackAllocData *)0x0);
    pVVar1 = (ValueType *)&DAT_00000008;
  }
  else {
    sVar2 = 0xffffffffffffffff;
    if (-1 < (long)count) {
      sVar2 = count * 2;
    }
    pVVar1 = (ValueType *)
             new__<Memory::Recycler>(sVar2,(Recycler *)this,(offset_in_Recycler_to_subr)allocator);
    sVar2 = 0;
    do {
      ValueType::ValueType((ValueType *)((long)&pVVar1->field_0 + sVar2));
      sVar2 = sVar2 + 2;
    } while (count * 2 != sVar2);
  }
  return pVVar1;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}